

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

void tcp_dialer_dial(void *arg,nng_aio *aio)

{
  _Bool _Var1;
  nng_aio *pnVar2;
  tcp_dialer *d;
  nng_aio *aio_local;
  void *arg_local;
  
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)((long)arg + 0x588));
  if ((*(byte *)((long)arg + 0x148) & 1) == 0) {
    _Var1 = nni_aio_start(aio,tcp_dial_cancel,arg);
    if (_Var1) {
      nni_list_append((nni_list *)((long)arg + 0x570),aio);
      pnVar2 = (nng_aio *)nni_list_first((nni_list *)((long)arg + 0x570));
      if (pnVar2 == aio) {
        tcp_dial_start_next((tcp_dialer *)arg);
      }
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x588));
    }
    else {
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x588));
    }
  }
  else {
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x588));
    nni_aio_finish_error(aio,NNG_ECLOSED);
  }
  return;
}

Assistant:

static void
tcp_dialer_dial(void *arg, nng_aio *aio)
{
	tcp_dialer *d = arg;

	nni_aio_reset(aio);
	nni_mtx_lock(&d->mtx);
	if (d->closed) {
		nni_mtx_unlock(&d->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	if (!nni_aio_start(aio, tcp_dial_cancel, d)) {
		nni_mtx_unlock(&d->mtx);
		return;
	}
	nni_list_append(&d->conaios, aio);
	if (nni_list_first(&d->conaios) == aio) {
		tcp_dial_start_next(d);
	}
	nni_mtx_unlock(&d->mtx);
}